

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O0

int lj_ccall_func(lua_State *L,GCcdata *cd)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  TValue *pTVar4;
  long in_RSI;
  long in_RDI;
  TValue tv;
  int ret;
  int gcsteps;
  CCallState cc;
  CTSize sz;
  CType *ct;
  CTState *cts;
  CTState *cts_1;
  CType *ct_1;
  int local_2d0;
  int local_2cc;
  cTValue *in_stack_fffffffffffffd48;
  CCallState *in_stack_fffffffffffffd50;
  lua_State *in_stack_fffffffffffffd58;
  CTState *in_stack_fffffffffffffd60;
  lua_State *in_stack_fffffffffffffd68;
  CCallState *in_stack_fffffffffffffde0;
  CType *in_stack_fffffffffffffde8;
  CTState *in_stack_fffffffffffffdf0;
  lua_State *in_stack_fffffffffffffdf8;
  uint local_fc;
  uint *local_f8;
  int local_d4;
  uint *local_c0;
  uint *local_98;
  lua_State *local_78;
  
  plVar3 = (long *)(ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194);
  plVar3[2] = in_RDI;
  for (local_c0 = (uint *)(*plVar3 + (ulong)*(ushort *)(in_RSI + 6) * 0x10); *local_c0 >> 0x1c == 8;
      local_c0 = (uint *)(*plVar3 + (ulong)(*local_c0 & 0xffff) * 0x10)) {
  }
  local_f8 = local_c0;
  local_fc = 8;
  if (*local_c0 >> 0x1c == 2) {
    local_fc = local_c0[1];
    local_98 = local_c0;
    do {
      local_f8 = (uint *)(*plVar3 + (ulong)(*local_98 & 0xffff) * 0x10);
      local_98 = local_f8;
    } while (*local_f8 >> 0x1c == 8);
  }
  if (*local_f8 >> 0x1c == 6) {
    if (local_fc == 4) {
      local_78 = (lua_State *)(ulong)*(uint *)(in_RSI + 8);
    }
    else {
      local_78 = *(lua_State **)(in_RSI + 8);
    }
    iVar1 = ccall_set_args(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                           in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
    *(undefined4 *)(plVar3 + 0x19) = 0xffffffff;
    lj_vm_ffi_call(&stack0xfffffffffffffd38);
    if ((int)plVar3[0x19] != -1) {
      pTVar4 = lj_tab_set(in_stack_fffffffffffffd58,(GCtab *)in_stack_fffffffffffffd50,
                          in_stack_fffffffffffffd48);
      (pTVar4->field_2).it = 0xfffffffd;
    }
    iVar2 = ccall_get_results(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                              (CType *)in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,
                              (int *)&in_stack_fffffffffffffd48->u64);
    local_2cc = iVar2 + iVar1;
    while (iVar1 = local_2cc + -1, 0 < local_2cc) {
      local_2cc = iVar1;
      if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
          *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
        lj_gc_step(local_78);
      }
    }
    local_d4 = local_2d0;
  }
  else {
    local_d4 = -1;
  }
  return local_d4;
}

Assistant:

int lj_ccall_func(lua_State *L, GCcdata *cd)
{
  CTState *cts = ctype_cts(L);
  CType *ct = ctype_raw(cts, cd->ctypeid);
  CTSize sz = CTSIZE_PTR;
  if (ctype_isptr(ct->info)) {
    sz = ct->size;
    ct = ctype_rawchild(cts, ct);
  }
  if (ctype_isfunc(ct->info)) {
    CCallState cc;
    int gcsteps, ret;
    cc.func = (void (*)(void))cdata_getptr(cdataptr(cd), sz);
    gcsteps = ccall_set_args(L, cts, ct, &cc);
    ct = (CType *)((intptr_t)ct-(intptr_t)cts->tab);
    cts->cb.slot = ~0u;
    lj_vm_ffi_call(&cc);
    if (cts->cb.slot != ~0u) {  /* Blacklist function that called a callback. */
      TValue tv;
      tv.u64 = ((uintptr_t)(void *)cc.func >> 2) | U64x(800000000, 00000000);
      setboolV(lj_tab_set(L, cts->miscmap, &tv), 1);
    }
    ct = (CType *)((intptr_t)ct+(intptr_t)cts->tab);  /* May be reallocated. */
    gcsteps += ccall_get_results(L, cts, ct, &cc, &ret);
#if LJ_TARGET_X86 && LJ_ABI_WIN
    /* Automatically detect __stdcall and fix up C function declaration. */
    if (cc.spadj && ctype_cconv(ct->info) == CTCC_CDECL) {
      CTF_INSERT(ct->info, CCONV, CTCC_STDCALL);
      lj_trace_abort(G(L));
    }
#endif
    while (gcsteps-- > 0)
      lj_gc_check(L);
    return ret;
  }
  return -1;  /* Not a function. */
}